

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O0

vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> * __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::getObjects
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this)

{
  bool bVar1;
  value_type *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
  *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>
  *obj;
  iterator __end0;
  iterator __begin0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
  *__range3;
  lock_guard<std::mutex> lock;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *objs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
  *this_00;
  reference in_stack_ffffffffffffffb0;
  _Self local_48;
  _Self local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  byte local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
  vector((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *)
         0x458b9e);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this_00,(mutex_type *)in_RDI);
  local_38 = &in_RSI[2].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
       ::begin(in_RDI);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator==(&local_40,&local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb0 =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>
         ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>
                      *)0x458bfc);
    std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
    push_back((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
               *)in_stack_ffffffffffffffb0,in_RSI);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>
                  *)this_00);
  }
  local_11 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x458c5c);
  if ((local_11 & 1) == 0) {
    std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
    ~vector((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
             *)in_stack_ffffffffffffffb0);
  }
  return (vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *)
         this_00;
}

Assistant:

std::vector<std::shared_ptr<X>> getObjects()
    {
        std::vector<std::shared_ptr<X>> objs;
        std::lock_guard<std::mutex> lock(mapLock);
        for (auto& obj : objectMap) {
            objs.push_back(obj.second);
        }
        return objs;
    }